

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolderTests.cpp
# Opt level: O0

void __thiscall SOH_basic_Test::TestBody(SOH_basic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *lhs;
  char *in_R9;
  string local_228;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__1;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res2;
  string local_1a0;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  string local_110 [32];
  undefined1 local_f0 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  SOH1;
  SOH_basic_Test *this_local;
  
  SOH1.typeMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  gmlc::concurrency::
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::SearchableObjectHolder
            ((SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"test1",&local_b9);
  std::make_shared<std::__cxx11::string,char_const(&)[7]>
            ((char (*) [7])
             &res.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  gmlc::concurrency::
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::addObject((SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)local_98,&local_b8,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&res.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&res.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"test1",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  gmlc::concurrency::
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::findObject((SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_f0,(string *)local_98);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::AssertionResult::AssertionResult<std::shared_ptr<std::__cxx11::string>>
            ((AssertionResult *)local_128,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_f0,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_128,(AssertionResult *)0x19fe76,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/SearchableObjectHolderTests.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    testing::Message::~Message(&local_130);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    lhs = std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
              ((EqHelper *)local_170,"*res","\"test_1\"",lhs,(char (*) [7])"test_1");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/SearchableObjectHolderTests.cpp"
                 ,0x1f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      testing::Message::~Message(&local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"test1",
               (allocator<char> *)
               ((long)&res2.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    gmlc::concurrency::
    SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::removeObject((SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)local_98,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&res2.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d8,"test1",
               (allocator<char> *)
               ((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    gmlc::concurrency::
    SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::findObject((SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)local_1b8,(string *)local_98);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_1f1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1b8);
    local_1f1 = !local_1f1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_228,(internal *)local_1f0,(AssertionResult *)"res2","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/SearchableObjectHolderTests.cpp"
                 ,0x23,pcVar2);
      testing::internal::AssertHelper::operator=(&local_208,&local_200);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1b8);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_f0);
  gmlc::concurrency::
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::~SearchableObjectHolder
            ((SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_98);
  return;
}

Assistant:

TEST(SOH, basic)
{
    SearchableObjectHolder<std::string> SOH1;
    SOH1.addObject("test1", std::make_shared<std::string>("test_1"));

    auto res = SOH1.findObject("test1");
    ASSERT_TRUE(res);
    EXPECT_EQ(*res, "test_1");

    SOH1.removeObject("test1");
    auto res2 = SOH1.findObject("test1");
    EXPECT_FALSE(res2);
}